

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<64U,_unsigned_short,_void,_true> __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_true>::operator-
          (uintwide_t<64U,_unsigned_short,_void,_true> *this)

{
  uintwide_t<64U,_unsigned_short,_void,_true> tmp;
  representation_type local_10;
  
  local_10.super_array<unsigned_short,_4UL>.elems =
       *(array<unsigned_short,_4UL> *)(this->values).super_array<unsigned_short,_4UL>.elems;
  negate((uintwide_t<64U,_unsigned_short,_void,_true> *)&local_10);
  return (uintwide_t<64U,_unsigned_short,_void,_true>)
         local_10.super_array<unsigned_short,_4UL>.elems;
}

Assistant:

constexpr auto operator-() const ->       uintwide_t  { uintwide_t tmp(*this); tmp.negate(); return tmp; }